

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinExtVar
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  uint *puVar1;
  Frame *this_00;
  HeapEntity *pHVar2;
  pointer pFVar3;
  iterator iVar4;
  long *plVar5;
  RuntimeError *__return_storage_ptr__;
  allocator_type *in_RCX;
  UString *pUVar6;
  AST *pAVar7;
  Value VVar8;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  string msg;
  string var8;
  AST *expr;
  Tokens tokens;
  undefined1 local_a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  AST *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_38;
  
  local_80._M_allocated_capacity = (size_type)&local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"extVar","");
  local_a0._0_4_ = 0x13;
  __l._M_len = 1;
  __l._M_array = (iterator)local_a0;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_38,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)&local_80,args,&local_38);
  if (local_38.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_allocated_capacity != &local_70) {
    operator_delete((void *)local_80._M_allocated_capacity,local_70._M_allocated_capacity + 1);
  }
  pHVar2 = (((args->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             )._M_impl.super__Vector_impl_data._M_start)->v).h;
  encode_utf8((string *)&local_80,(internal *)pHVar2[1]._vptr_HeapEntity,
              *(UString **)&pHVar2[1].mark);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
          ::find(&(this->externalVars)._M_t,(key_type *)&local_80);
  if ((_Rb_tree_header *)iVar4._M_node != &(this->externalVars)._M_t._M_impl.super__Rb_tree_header)
  {
    if ((char)iVar4._M_node[3]._M_color == _S_black) {
      std::operator+(&local_58,"<extvar:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80)
      ;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
      pUVar6 = (UString *)(plVar5 + 2);
      if ((UString *)*plVar5 == pUVar6) {
        local_a0._16_8_ = (pUVar6->_M_dataplus)._M_p;
        local_a0._24_8_ = plVar5[3];
        local_a0._0_8_ = (UString *)(local_a0 + 0x10);
      }
      else {
        local_a0._16_8_ = (pUVar6->_M_dataplus)._M_p;
        local_a0._0_8_ = (UString *)*plVar5;
      }
      local_a0._8_8_ = plVar5[1];
      *plVar5 = (long)pUVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      jsonnet_lex((Tokens *)&local_58,(string *)local_a0,*(char **)(iVar4._M_node + 2));
      local_60 = jsonnet_parse(this->alloc,(Tokens *)&local_58);
      jsonnet_desugar(this->alloc,&local_60,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
                       *)0x0);
      jsonnet_static_analysis(local_60);
      pFVar3 = (this->stack).stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = pFVar3 + -1;
      if (pFVar3[-1].kind == FRAME_CALL) {
        puVar1 = &(this->stack).calls;
        *puVar1 = *puVar1 - 1;
      }
      (this->stack).stack.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish = this_00;
      Frame::~Frame(this_00);
      pAVar7 = local_60;
      std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
      ::_M_clear((_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
                 &local_58);
      if ((UString *)local_a0._0_8_ != (UString *)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
    }
    else {
      decode_utf8((UString *)local_a0,(string *)(iVar4._M_node + 2));
      VVar8 = makeString(this,(UString *)local_a0._0_8_);
      (this->scratch).t = STRING;
      (this->scratch).v = VVar8._0_8_;
      if ((UString *)local_a0._0_8_ != (UString *)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ * 4 + 4);
      }
      pAVar7 = (AST *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_allocated_capacity != &local_70) {
      operator_delete((void *)local_80._M_allocated_capacity,local_70._M_allocated_capacity + 1);
    }
    return pAVar7;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 "undefined external variable: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  Stack::makeError(__return_storage_ptr__,&this->stack,loc,(string *)local_a0);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinExtVar(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "extVar", args, {Value::STRING});
        const UString &var = static_cast<HeapString *>(args[0].v.h)->value;
        std::string var8 = encode_utf8(var);
        auto it = externalVars.find(var8);
        if (it == externalVars.end()) {
            std::string msg = "undefined external variable: " + var8;
            throw makeError(loc, msg);
        }
        const VmExt &ext = it->second;
        if (ext.isCode) {
            std::string filename = "<extvar:" + var8 + ">";
            Tokens tokens = jsonnet_lex(filename, ext.data.c_str());
            AST *expr = jsonnet_parse(alloc, tokens);
            jsonnet_desugar(alloc, expr, nullptr);
            jsonnet_static_analysis(expr);
            stack.pop();
            return expr;
        } else {
            scratch = makeString(decode_utf8(ext.data));
            return nullptr;
        }
    }